

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
tf::detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (int *param_1,int *param_2)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b_00;
  bool bVar1;
  uchar uVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var4;
  ulong uVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  unsigned_long *puVar6;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  size_t num;
  uchar i_3;
  uchar i_2;
  uchar i_1;
  uchar i;
  size_t right_split;
  size_t left_split;
  size_t num_unknown;
  size_t start_r;
  size_t start_l;
  size_t num_r;
  size_t num_l;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> offsets_r_base;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> offsets_l_base;
  uchar *offsets_r;
  uchar *offsets_l;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  T pivot;
  size_t cacheline_size;
  size_t block_size;
  undefined4 in_stack_fffffffffffffda8;
  int iVar8;
  undefined4 in_stack_fffffffffffffdac;
  int iVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffdb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffdb8;
  ulong local_240;
  ulong local_238;
  byte local_229;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_218;
  int *local_210;
  undefined8 in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  uchar *in_stack_fffffffffffffe08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  byte local_1d4;
  byte local_1d3;
  byte local_1d2;
  byte local_1d1;
  long local_1b8;
  long local_1b0;
  unsigned_long local_1a8;
  unsigned_long local_1a0;
  int *local_198;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_190;
  uchar *local_188;
  uchar *local_180;
  uchar local_178 [128];
  uchar local_f8 [136];
  int *local_70;
  int *local_68;
  undefined1 local_59;
  int *local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  int local_3c [6];
  less<int> local_21;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18 [3];
  
  local_3c[3] = 0x40;
  local_3c[4] = 0;
  local_3c[1] = 0x40;
  local_3c[2] = 0;
  local_20 = param_2;
  local_18[0]._M_current = param_1;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  local_3c[0] = *piVar3;
  local_48._M_current = local_18[0]._M_current;
  local_50._M_current = local_20;
  do {
    p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&local_48);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (p_Var4);
    bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
  } while (bVar1);
  local_58 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator-(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffdb0._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffdb0._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      local_229 = 0;
      if (bVar1) {
        p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_50);
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(p_Var4);
        bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
        local_229 = bVar1 ^ 0xff;
      }
    } while ((local_229 & 1) != 0);
  }
  else {
    do {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_50);
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(p_Var4);
      bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_59 = __gnu_cxx::operator>=
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_fffffffffffffdb0._M_current,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  if (!(bool)local_59) {
    local_68 = local_48._M_current;
    local_70 = local_50._M_current;
    _Var10._M_current._4_4_ = in_stack_fffffffffffffdac;
    _Var10._M_current._0_4_ = in_stack_fffffffffffffda8;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (in_stack_fffffffffffffdb0,_Var10);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
    local_180 = align_cacheline<unsigned_char,64ul>(local_f8);
    local_188 = align_cacheline<unsigned_char,64ul>(local_178);
    local_190._M_current = local_48._M_current;
    local_198 = local_50._M_current;
    local_1b8 = 0;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    while (bVar1 = __gnu_cxx::operator<
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffdb0._M_current,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)), bVar1)
    {
      uVar5 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffdb0._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      if (local_1a0 == 0) {
        local_238 = uVar5;
        if (local_1a8 == 0) {
          local_238 = uVar5 >> 1;
        }
        local_240 = local_238;
      }
      else {
        local_240 = 0;
      }
      if (local_1a8 == 0) {
        p_Var4 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 (uVar5 - local_240);
      }
      else {
        p_Var4 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)0x0;
      }
      in_stack_fffffffffffffdb8 = p_Var4;
      if (local_240 < 0x40) {
        local_1d2 = 0;
        while (local_1d2 < local_240) {
          local_180[local_1a0] = local_1d2;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          local_1d2 = local_1d2 + 1;
        }
      }
      else {
        local_1d1 = 0;
        while (local_1d1 < 0x40) {
          local_180[local_1a0] = local_1d1;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          local_180[local_1a0] = local_1d1 + 1;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          local_180[local_1a0] = local_1d1 + 2;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          local_180[local_1a0] = local_1d1 + 3;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          local_180[local_1a0] = local_1d1 + 4;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          local_180[local_1a0] = local_1d1 + 5;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          uVar2 = local_1d1 + 7;
          local_180[local_1a0] = local_1d1 + 6;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          local_1d1 = local_1d1 + 8;
          local_180[local_1a0] = uVar2;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a0 = ((bVar1 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
        }
      }
      if (p_Var4 < (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)0x40) {
        local_1d4 = 0;
        while ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)(ulong)local_1d4
               < p_Var4) {
          local_1d4 = local_1d4 + 1;
          local_188[local_1a8] = local_1d4;
          this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(this);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
        }
      }
      else {
        local_1d3 = 0;
        while (local_1d3 < 0x40) {
          local_188[local_1a8] = local_1d3 + 1;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
          local_188[local_1a8] = local_1d3 + 2;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
          local_188[local_1a8] = local_1d3 + 3;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
          local_188[local_1a8] = local_1d3 + 4;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
          local_188[local_1a8] = local_1d3 + 5;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
          local_188[local_1a8] = local_1d3 + 6;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
          local_188[local_1a8] = local_1d3 + 7;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
          local_1d3 = local_1d3 + 8;
          local_188[local_1a8] = local_1d3;
          p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_50);
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(p_Var4);
          bVar1 = std::less<int>::operator()(&local_21,piVar3,local_3c);
          local_1a8 = bVar1 + local_1a8;
        }
      }
      puVar6 = std::min<unsigned_long>(&local_1a0,&local_1a8);
      _Var10._M_current = (int *)*puVar6;
      swap_offsets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (_Var10,local_190,(uchar *)local_198,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
      local_1a0 = local_1a0 - (long)_Var10._M_current;
      local_1a8 = local_1a8 - (long)_Var10._M_current;
      local_1b0 = (long)_Var10._M_current + local_1b0;
      local_1b8 = (long)_Var10._M_current + local_1b8;
      if (local_1a0 == 0) {
        local_1b0 = 0;
        local_190._M_current = local_48._M_current;
      }
      if (local_1a8 == 0) {
        local_1b8 = 0;
        local_198 = local_50._M_current;
      }
    }
    if (local_1a0 != 0) {
      local_180 = local_180 + local_1b0;
      while (local_1a0 != 0) {
        local_1a0 = local_1a0 - 1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
                  (&local_50);
        __b._M_current._4_4_ = in_stack_fffffffffffffdac;
        __b._M_current._0_4_ = in_stack_fffffffffffffda8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffdb0,__b);
      }
      local_48._M_current = local_50._M_current;
      local_1a0 = local_1a0 - 1;
    }
    if (local_1a8 != 0) {
      local_188 = local_188 + local_1b8;
      while (local_1a8 != 0) {
        local_1a8 = local_1a8 - 1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0._M_current);
        local_210 = local_48._M_current;
        __b_00._M_current._4_4_ = in_stack_fffffffffffffdac;
        __b_00._M_current._0_4_ = in_stack_fffffffffffffda8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (in_stack_fffffffffffffdb0,__b_00);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_48);
      }
      local_50._M_current = local_48._M_current;
      local_1a8 = local_1a8 - 1;
    }
  }
  local_218 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator-(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0._M_current);
  p_Var4 = &local_218;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var4);
  iVar8 = *piVar3;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  *piVar3 = iVar8;
  iVar9 = local_3c[0];
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var4);
  *piVar3 = iVar9;
  pVar7 = std::
          make_pair<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>&,bool&>
                    (p_Var4,(bool *)CONCAT44(iVar9,iVar8));
  return pVar7;
}

Assistant:

std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {

  typedef typename std::iterator_traits<Iter>::value_type T;

  constexpr size_t block_size = 64;
  constexpr size_t cacheline_size = 64;

  // Move pivot into local for speed.
  T pivot(std::move(*begin));
  Iter first = begin;
  Iter last = end;

  // Find the first element greater than or equal than the pivot (the median of 3 guarantees
  // this exists).
  while (comp(*++first, pivot));

  // Find the first element strictly smaller than the pivot. We have to guard this search if
  // there was no element before *first.
  if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
  else                    while (                !comp(*--last, pivot));

  // If the first pair of elements that should be swapped to partition are the same element,
  // the passed in sequence already was correctly partitioned.
  bool already_partitioned = first >= last;
  if (!already_partitioned) {
    std::iter_swap(first, last);
    ++first;

    // The following branchless partitioning is derived from "BlockQuicksort: How Branch
    // Mispredictions don't affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
    // heavily micro-optimized.
    unsigned char offsets_l_storage[block_size + cacheline_size];
    unsigned char offsets_r_storage[block_size + cacheline_size];
    unsigned char* offsets_l = align_cacheline(offsets_l_storage);
    unsigned char* offsets_r = align_cacheline(offsets_r_storage);

    Iter offsets_l_base = first;
    Iter offsets_r_base = last;
    size_t num_l, num_r, start_l, start_r;
    num_l = num_r = start_l = start_r = 0;

    while (first < last) {
      // Fill up offset blocks with elements that are on the wrong side.
      // First we determine how much elements are considered for each offset block.
      size_t num_unknown = last - first;
      size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
      size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

      // Fill the offset blocks.
      if (left_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      } else {
        for (unsigned char i = 0; i < left_split;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      }

      if (right_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      } else {
        for (unsigned char i = 0; i < right_split;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      }

      // Swap elements and update block sizes and first/last boundaries.
      size_t num = std::min(num_l, num_r);
      swap_offsets(
        offsets_l_base, offsets_r_base, 
        offsets_l + start_l, offsets_r + start_r,
        num, num_l == num_r
      );
      num_l -= num; num_r -= num;
      start_l += num; start_r += num;

      if (num_l == 0) {
        start_l = 0;
        offsets_l_base = first;
      }

      if (num_r == 0) {
        start_r = 0;
        offsets_r_base = last;
      }
    }

    // We have now fully identified [first, last)'s proper position. Swap the last elements.
    if (num_l) {
      offsets_l += start_l;
      while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
      first = last;
    }
    if (num_r) {
      offsets_r += start_r;
      while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
      last = first;
    }
  }

  // Put the pivot in the right place.
  Iter pivot_pos = first - 1;
  *begin = std::move(*pivot_pos);
  *pivot_pos = std::move(pivot);

  return std::make_pair(pivot_pos, already_partitioned);
}